

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemTools::SplitPath
               (string *p,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,bool expand_home_dir)

{
  char cVar1;
  char *pcVar2;
  passwd *ppVar3;
  string homedir;
  char *first;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(components);
  first = (char *)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  pcVar2 = SplitPathRootComponent(p,(string *)&first);
  if (((expand_home_dir) && (local_40 != 0)) && (*first == '~')) {
    homedir._M_dataplus._M_p = (pointer)&homedir.field_2;
    homedir._M_string_length = 0;
    homedir.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)&first);
    if (local_40 == 1) {
      GetEnv("HOME",&homedir);
    }
    else {
      ppVar3 = getpwnam(first + 1);
      if ((ppVar3 != (passwd *)0x0) && (ppVar3->pw_dir != (char *)0x0)) {
        std::__cxx11::string::assign((char *)&homedir);
      }
    }
    if ((homedir._M_string_length != 0) &&
       ((homedir._M_dataplus._M_p[homedir._M_string_length - 1] == '\\' ||
        (homedir._M_dataplus._M_p[homedir._M_string_length - 1] == '/')))) {
      std::__cxx11::string::resize((ulong)&homedir);
    }
    SplitPath(&homedir,components,true);
    std::__cxx11::string::~string((string *)&homedir);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,(value_type *)&first);
  }
  std::__cxx11::string::~string((string *)&first);
  homedir._M_dataplus._M_p = pcVar2;
  first = pcVar2;
  do {
    cVar1 = *homedir._M_dataplus._M_p;
    if ((cVar1 == '/') || (cVar1 == '\\')) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
                 &first,(char **)&homedir);
      first = homedir._M_dataplus._M_p + 1;
    }
    else if (cVar1 == '\0') {
      if (homedir._M_dataplus._M_p != pcVar2) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&,char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)components,
                   &first,(char **)&homedir);
      }
      return;
    }
    homedir._M_dataplus._M_p = homedir._M_dataplus._M_p + 1;
  } while( true );
}

Assistant:

void SystemTools::SplitPath(const std::string& p,
                            std::vector<std::string>& components,
                            bool expand_home_dir)
{
  const char* c;
  components.clear();

  // Identify the root component.
  {
    std::string root;
    c = SystemTools::SplitPathRootComponent(p, &root);

    // Expand home directory references if requested.
    if (expand_home_dir && !root.empty() && root[0] == '~') {
      std::string homedir;
      root.resize(root.size() - 1);
      if (root.size() == 1) {
#if defined(_WIN32) && !defined(__CYGWIN__)
        if (!SystemTools::GetEnv("USERPROFILE", homedir))
#endif
          SystemTools::GetEnv("HOME", homedir);
      }
#ifdef HAVE_GETPWNAM
      else if (passwd* pw = getpwnam(root.c_str() + 1)) {
        if (pw->pw_dir) {
          homedir = pw->pw_dir;
        }
      }
#endif
      if (!homedir.empty() &&
          (homedir.back() == '/' || homedir.back() == '\\')) {
        homedir.resize(homedir.size() - 1);
      }
      SystemTools::SplitPath(homedir, components);
    } else {
      components.push_back(root);
    }
  }

  // Parse the remaining components.
  const char* first = c;
  const char* last = first;
  for (; *last; ++last) {
    if (*last == '/' || *last == '\\') {
      // End of a component.  Save it.
      components.emplace_back(first, last);
      first = last + 1;
    }
  }

  // Save the last component unless there were no components.
  if (last != c) {
    components.emplace_back(first, last);
  }
}